

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O1

uint32_t __thiscall
ddd::DictionaryMLT<true,_true>::search_key(DictionaryMLT<true,_true> *this,char *key)

{
  bool bVar1;
  uint32_t uVar2;
  Query query;
  Query local_20;
  
  local_20.pos_ = 0;
  local_20.value_ = 0x7fffffff;
  local_20.node_pos_ = 0;
  local_20.is_finished_ = false;
  local_20.key_ = key;
  bVar1 = DaTrie<true,_true,_true>::search_prefix
                    (*(DaTrie<true,_true,_true> **)(this + 8),&local_20);
  uVar2 = 0xffffffff;
  if (bVar1) {
    if (local_20.is_finished_ != true) {
      local_20.node_pos_ = 0;
      bVar1 = DaTrie<true,_true,_false>::search_key
                        (*(DaTrie<true,_true,_false> **)
                          (*(long *)(this + 0x10) + ((ulong)local_20._8_8_ >> 0x20) * 8),&local_20);
      if (!bVar1) {
        return 0xffffffff;
      }
    }
    uVar2 = local_20.value_;
  }
  return uVar2;
}

Assistant:

uint32_t search_key(const char* key) const {
    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      return NOT_FOUND;
    }

    if (query.is_finished()) {
      return query.value();
    }

    query.set_node_pos(ROOT_POS);
    if (!suffix_subtries_[query.value()]->search_key(query)) {
      return NOT_FOUND;
    }
    return query.value();
  }